

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzz-test.c++
# Opt level: O0

uint64_t capnp::_::anon_unknown_0::traverse(Reader reader)

{
  Reader list;
  uint64_t uVar1;
  Reader *this;
  Reader local_70;
  byte local_39;
  uchar *puStack_38;
  byte b;
  uchar *__end2;
  uchar *__begin2;
  ArrayPtr<const_unsigned_char> *local_18;
  ArrayPtr<const_unsigned_char> *__range2;
  uint64_t result;
  
  this = (Reader *)&stack0x00000008;
  __range2 = (ArrayPtr<const_unsigned_char> *)0x0;
  ___begin2 = AnyStruct::Reader::getDataSection(this);
  local_18 = (ArrayPtr<const_unsigned_char> *)&__begin2;
  __end2 = kj::ArrayPtr<const_unsigned_char>::begin(local_18);
  puStack_38 = kj::ArrayPtr<const_unsigned_char>::end(local_18);
  for (; __end2 != puStack_38; __end2 = __end2 + 1) {
    local_39 = *__end2;
    __range2 = (ArrayPtr<const_unsigned_char> *)((long)&__range2->ptr + (ulong)local_39);
  }
  AnyStruct::Reader::getPointerSection(&local_70,this);
  list.reader.capTable = (CapTableReader *)local_70.reader.ptr;
  list.reader.segment = (SegmentReader *)local_70.reader.capTable;
  list.reader.ptr = (byte *)local_70.reader._24_8_;
  list.reader._24_8_ = local_70.reader._32_8_;
  list.reader.structDataSize = local_70.reader.nestingLimit;
  list.reader.structPointerCount = local_70.reader._44_2_;
  list.reader.elementSize = local_70.reader._46_1_;
  list.reader._39_1_ = local_70.reader._47_1_;
  list.reader._40_8_ = this;
  uVar1 = (anonymous_namespace)::traverseList<capnp::List<capnp::AnyPointer,(capnp::Kind)7>::Reader>
                    (list);
  return (long)&__range2->ptr + uVar1;
}

Assistant:

uint64_t traverse(AnyStruct::Reader reader) {
  uint64_t result = 0;
  for (byte b: reader.getDataSection()) {
    result += b;
  }
  result += traverseList(reader.getPointerSection());
  return result;
}